

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

void __thiscall QHostInfoRunnable::~QHostInfoRunnable(QHostInfoRunnable *this)

{
  Data *pDVar1;
  
  *(undefined ***)this = &PTR_run_002cbe10;
  QHostInfoResult::~QHostInfoResult(&this->resultEmitter);
  pDVar1 = (this->toBeLookedUp).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->toBeLookedUp).d.d)->super_QArrayData,2,0x10);
    }
  }
  QRunnable::~QRunnable(&this->super_QRunnable);
  return;
}

Assistant:

QHostInfoRunnable::~QHostInfoRunnable()
    = default;